

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData * __thiscall cfd::core::HashUtil::Output(ByteData *__return_storage_ptr__,HashUtil *this)

{
  CfdException *this_00;
  string *this_01;
  string local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  switch(this->hash_type_) {
  case '\x01':
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
                       &this->buffer_);
    Ripemd160((ByteData160 *)&local_50,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
    ByteData160::GetData(__return_storage_ptr__,(ByteData160 *)&local_50);
    break;
  case '\x02':
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
                       &this->buffer_);
    Hash160((ByteData160 *)&local_50,
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
    ByteData160::GetData(__return_storage_ptr__,(ByteData160 *)&local_50);
    break;
  case '\x03':
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
                       &this->buffer_);
    Sha256((ByteData256 *)&local_50,
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
    ByteData256::GetData(__return_storage_ptr__,(ByteData256 *)&local_50);
    break;
  case '\x04':
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
                       &this->buffer_);
    Sha256D((ByteData256 *)&local_50,
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
    ByteData256::GetData(__return_storage_ptr__,(ByteData256 *)&local_50);
    break;
  case '\x05':
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
                       &this->buffer_);
    Sha512(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50
          );
    this_01 = &local_50;
    goto LAB_003503d6;
  default:
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&local_50,"unknown hash type.",(allocator *)&local_30);
    CfdException::CfdException(this_00,kCfdInternalError,&local_50);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  this_01 = (string *)&local_30;
LAB_003503d6:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Output() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes()).GetData();
    case kHash160:
      return Hash160(buffer_.GetBytes()).GetData();
    case kSha256:
      return Sha256(buffer_.GetBytes()).GetData();
    case kSha256D:
      return Sha256D(buffer_.GetBytes()).GetData();
    case kSha512:
      return Sha512(buffer_.GetBytes());
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}